

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O1

void jsoncons::encode_json<std::pair<int,std::__cxx11::string>,wchar_t>
               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *val,basic_json_visitor<wchar_t> *encoder)

{
  ser_error *this;
  undefined8 extraout_RAX;
  error_code ec_00;
  error_code ec;
  error_code local_38;
  anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>_5
  local_28;
  
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  local_28.common_ = (common_storage)0x4;
  encode_traits<std::pair<int,std::__cxx11::string>,wchar_t,void>::
  encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
            (val,encoder,
             (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
             &local_28.common_,&local_38);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::destroy
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
             &local_28.common_);
  if (local_38._M_value == 0) {
    (*encoder->_vptr_basic_json_visitor[2])(encoder);
    return;
  }
  this = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_38._M_value;
  ec_00._M_cat = local_38._M_cat;
  ser_error::ser_error(this,ec_00);
  encode_json<std::pair<int,std::__cxx11::string>,wchar_t>((jsoncons *)this);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

void encode_json(const T& val, basic_json_visitor<CharT>& encoder)
    {
        std::error_code ec;
        encode_traits<T,CharT>::encode(val, encoder, basic_json<CharT>(), ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        encoder.flush();
    }